

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall Net::send_with_retry(Net *this,string *request)

{
  int iVar1;
  ostream *poVar2;
  
  do {
    iVar1 = BIO_write((BIO *)this->sock,(request->_M_dataplus)._M_p,
                      (int)request->_M_string_length + 1);
    if (0 < iVar1) {
      return;
    }
    iVar1 = BIO_test_flags((BIO *)this->sock,8);
  } while (iVar1 != 0);
  poVar2 = std::operator<<((ostream *)&std::cout,"send error");
  std::endl<char,std::char_traits<char>>(poVar2);
  this->closed = 1;
  return;
}

Assistant:

void Net::send_with_retry(std::string request){
	while(BIO_write(sock,request.c_str(),request.size()+1)<=0){
		if(!BIO_should_retry(sock)){
			std::cout<<"send error"<<std::endl;
			closed=1;
			return;
		}
	}
}